

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

DispatchBuilder * __thiscall kern::DispatchBuilder::filter(DispatchBuilder *this,FnFilter *func)

{
  void *__s;
  BuilderReuseException *in_RSI;
  function<bool_(const_kern::Metadata_&)> *in_RDI;
  function<bool_(const_kern::Metadata_&)> *unaff_retaddr;
  
  if (*(long *)&(in_RDI->super__Function_base)._M_functor == 0) {
    __s = (void *)__cxa_allocate_exception(8);
    memset(__s,0,8);
    BuilderReuseException::BuilderReuseException(in_RSI);
    __cxa_throw(__s,&BuilderReuseException::typeinfo,BuilderReuseException::~BuilderReuseException);
  }
  std::function<bool_(const_kern::Metadata_&)>::operator=(unaff_retaddr,in_RDI);
  return (DispatchBuilder *)in_RDI;
}

Assistant:

DispatchBuilder &DispatchBuilder::filter(FnFilter func) {
        if(this->inner == nullptr)
            throw BuilderReuseException();

        this->inner->filter_func = func;

        return *this;
    }